

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O3

Link * __thiscall Link::erase(Link *this)

{
  Link *pLVar1;
  Link *pLVar2;
  
  pLVar1 = this->prev;
  pLVar2 = this->succ;
  if (pLVar2 != (Link *)0x0) {
    pLVar2->prev = pLVar1;
  }
  if (pLVar1 != (Link *)0x0) {
    pLVar1->succ = pLVar2;
    pLVar2 = this->succ;
  }
  return pLVar2;
}

Assistant:

Link* Link::erase()
{
	if (!this)
		return nullptr;
	if (succ)
		succ->prev = prev;
	if (prev)
		prev->succ = succ;
	return succ;
}